

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O0

ThreadPriority dd::TaskQueuePriorityToThreadPriority(Priority priority)

{
  undefined4 local_c;
  Priority priority_local;
  
  if (priority == NORMAL) {
    local_c = kNormalPriority;
  }
  else if (priority == HIGH) {
    local_c = kRealtimePriority;
  }
  else if (priority == LOW) {
    local_c = kLowPriority;
  }
  else {
    local_c = kNormalPriority;
  }
  return local_c;
}

Assistant:

ThreadPriority TaskQueuePriorityToThreadPriority(TaskQueueFactory::Priority priority)
	{
		switch (priority) {
		case TaskQueueFactory::Priority::HIGH:
			return kRealtimePriority;
		case TaskQueueFactory::Priority::LOW:
			return kLowPriority;
		case TaskQueueFactory::Priority::NORMAL:
			return kNormalPriority;
		default:
			return kNormalPriority;
		}
	}